

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::~PortConnectionBuilder
          (PortConnectionBuilder *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  SmallVectorBase<slang::ConstantRange>::cleanup
            (&(this->instanceDims).super_SmallVectorBase<slang::ConstantRange>,in_RSI);
  PortConnection::ConnMap::~ConnMap(&this->connMap);
  return;
}

Assistant:

PortConnectionBuilder(const InstanceSymbol& instance,
                          const SeparatedSyntaxList<PortConnectionSyntax>& portConnections) :
        scope(*instance.getParentScope()), instance(instance), comp(scope.getCompilation()),
        lookupLocation(LookupLocation::after(instance)),
        connMap(portConnections, scope, lookupLocation) {

        // Build up the set of dimensions for the instantiating instance's array parent, if any.
        // This builds up the dimensions in reverse order, so we have to reverse them back.
        auto parent = &scope;
        while (parent && parent->asSymbol().kind == SymbolKind::InstanceArray) {
            auto& sym = parent->asSymbol().as<InstanceArraySymbol>();
            instanceDims.push_back(sym.range);
            parent = sym.getParentScope();
        }
        std::ranges::reverse(instanceDims);
    }